

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::Pooling3DLayerParams::_InternalSerialize
          (Pooling3DLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (this->type_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,this->type_,puVar1);
  }
  if (this->kerneldepth_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (2,this->kerneldepth_,puVar1);
  }
  if (this->kernelheight_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (3,this->kernelheight_,puVar1);
  }
  if (this->kernelwidth_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (4,this->kernelwidth_,puVar1);
  }
  if (this->stridedepth_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (5,this->stridedepth_,puVar1);
  }
  if (this->strideheight_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (6,this->strideheight_,puVar1);
  }
  if (this->stridewidth_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (7,this->stridewidth_,puVar1);
  }
  if (this->custompaddingfront_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (8,this->custompaddingfront_,puVar1);
  }
  if (this->custompaddingback_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (9,this->custompaddingback_,puVar1);
  }
  if (this->custompaddingtop_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (10,this->custompaddingtop_,puVar1);
  }
  if (this->custompaddingbottom_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0xb,this->custompaddingbottom_,puVar1);
  }
  if (this->custompaddingleft_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0xc,this->custompaddingleft_,puVar1);
  }
  if (this->custompaddingright_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0xd,this->custompaddingright_,puVar1);
  }
  if (this->countexcludepadding_ == true) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0xe,this->countexcludepadding_,puVar1);
  }
  if (this->paddingtype_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0xf,this->paddingtype_,puVar1);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  uVar2 = uVar2 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar2 + 8),*(int *)(uVar2 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* Pooling3DLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Pooling3DLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->_internal_type() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_type(), target);
  }

  // int32 kernelDepth = 2;
  if (this->_internal_kerneldepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_kerneldepth(), target);
  }

  // int32 kernelHeight = 3;
  if (this->_internal_kernelheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_kernelheight(), target);
  }

  // int32 kernelWidth = 4;
  if (this->_internal_kernelwidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_kernelwidth(), target);
  }

  // int32 strideDepth = 5;
  if (this->_internal_stridedepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(5, this->_internal_stridedepth(), target);
  }

  // int32 strideHeight = 6;
  if (this->_internal_strideheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(6, this->_internal_strideheight(), target);
  }

  // int32 strideWidth = 7;
  if (this->_internal_stridewidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_stridewidth(), target);
  }

  // int32 customPaddingFront = 8;
  if (this->_internal_custompaddingfront() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(8, this->_internal_custompaddingfront(), target);
  }

  // int32 customPaddingBack = 9;
  if (this->_internal_custompaddingback() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_custompaddingback(), target);
  }

  // int32 customPaddingTop = 10;
  if (this->_internal_custompaddingtop() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_custompaddingtop(), target);
  }

  // int32 customPaddingBottom = 11;
  if (this->_internal_custompaddingbottom() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_custompaddingbottom(), target);
  }

  // int32 customPaddingLeft = 12;
  if (this->_internal_custompaddingleft() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(12, this->_internal_custompaddingleft(), target);
  }

  // int32 customPaddingRight = 13;
  if (this->_internal_custompaddingright() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(13, this->_internal_custompaddingright(), target);
  }

  // bool countExcludePadding = 14;
  if (this->_internal_countexcludepadding() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_countexcludepadding(), target);
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->_internal_paddingtype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      15, this->_internal_paddingtype(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Pooling3DLayerParams)
  return target;
}